

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool __thiscall testing::internal::UnitTestImpl::RunAllTests(UnitTestImpl *this)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Type TVar6;
  int iVar7;
  TestEventListeners *this_00;
  TestEventListener *pTVar8;
  TimeInMillis TVar9;
  Random *this_01;
  UnitTestImpl *this_02;
  undefined8 uVar10;
  UnitTestImpl *in_RDI;
  UnitTestImpl *in_stack_00000080;
  string filter_warning;
  bool delete_environment_on_teardown;
  int test_index_1;
  int j_1;
  int test_index;
  string *result;
  TestPartResult *test_part_result;
  int j;
  TestResult *test_result;
  Timer timer;
  int i;
  bool recreate_environments_when_repeating;
  bool gtest_repeat_forever;
  int repeat;
  TestEventListener *repeater;
  bool failed;
  bool has_tests_to_run;
  bool should_shard;
  bool in_subprocess_for_death_test;
  bool fail_if_no_test_linked;
  char kNoTestLinkedWarning [35];
  char kNoTestLinkedFatal [69];
  char kNoTestLinkedMessage [50];
  bool gtest_is_initialized_before_run_all_tests;
  nullptr_t in_stack_fffffffffffffd48;
  UnitTestImpl *in_stack_fffffffffffffd50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined4 in_stack_fffffffffffffd58;
  int in_stack_fffffffffffffd5c;
  int in_stack_fffffffffffffd60;
  int in_stack_fffffffffffffd64;
  reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment_**,_std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>_>_>
  *in_stack_fffffffffffffd68;
  reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment_**,_std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>_>_>
  *in_stack_fffffffffffffd70;
  undefined2 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd82;
  undefined1 uVar11;
  undefined1 in_stack_fffffffffffffd83;
  bool bVar12;
  undefined1 uVar13;
  undefined4 in_stack_fffffffffffffd84;
  uint uVar14;
  uint uVar15;
  allocator<char> *in_stack_fffffffffffffd88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  allocator<char> local_251;
  string local_250 [16];
  undefined8 in_stack_fffffffffffffdc0;
  string local_230 [32];
  string local_210 [39];
  undefined1 local_1e9;
  int local_1d0;
  string local_1c8 [32];
  string *local_1a8;
  TestPartResult *local_1a0;
  undefined4 in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  uint local_17c;
  allocator<char> local_151;
  string local_150 [32];
  string local_130 [15];
  undefined1 in_stack_fffffffffffffedf;
  char *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  string local_110 [28];
  ReactionToSharding in_stack_ffffffffffffff0c;
  UnitTestImpl *in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [2];
  undefined1 local_48 [55];
  byte local_11;
  bool local_1;
  
  local_11 = GTestIsInitialized();
  if ((g_help_flag & 1) == 0) {
    PostFlagParsingInit((UnitTestImpl *)
                        CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    iVar4 = total_test_count(in_stack_fffffffffffffd50);
    if (iVar4 == 0) {
      memcpy(local_48,"This test program does NOT link in any test case.",0x32);
      memcpy(local_98,"This is INVALID. Please make sure to link in at least one test case.",0x45);
      memcpy(&local_c8,"Please make sure this is intended.",0x23);
      bVar1 = FLAGS_gtest_fail_if_no_test_linked & 1;
      if (bVar1 == 0) {
        in_stack_fffffffffffffd90 = &local_c8;
      }
      else {
        in_stack_fffffffffffffd90 = local_98;
      }
      ColoredPrintf(kRed,"%s %s\n",local_48,in_stack_fffffffffffffd90);
      if (bVar1 != 0) {
        return false;
      }
      in_stack_fffffffffffffd88 = &local_151;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88,
                 (allocator<char> *)
                 CONCAT44(in_stack_fffffffffffffd84,
                          CONCAT13(in_stack_fffffffffffffd83,
                                   CONCAT12(in_stack_fffffffffffffd82,in_stack_fffffffffffffd80))));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                     (char)((ulong)in_stack_fffffffffffffd50 >> 0x38));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                     (char *)in_stack_fffffffffffffd50);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                     (char)((ulong)in_stack_fffffffffffffd50 >> 0x38));
      AppendToTestWarningsOutputFile(in_stack_fffffffffffffd90);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff10);
      std::__cxx11::string::~string(local_110);
      std::__cxx11::string::~string(local_130);
      std::__cxx11::string::~string(local_150);
      std::allocator<char>::~allocator(&local_151);
    }
    WriteToShardStatusFileIfNeeded();
    bVar2 = std::operator!=((unique_ptr<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
                             *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    ShouldShard(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,(bool)in_stack_fffffffffffffedf)
    ;
    iVar4 = FilterTests(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
    if ((FLAGS_gtest_list_tests & 1) == 0) {
      iVar5 = GetRandomSeedFromFlag((int32_t)((ulong)in_stack_fffffffffffffd50 >> 0x20));
      in_RDI->random_seed_ = iVar5;
      bVar1 = 0;
      this_00 = listeners(in_RDI);
      pTVar8 = TestEventListeners::repeater(this_00);
      TVar9 = GetTimeInMillis();
      in_RDI->start_timestamp_ = TVar9;
      (*pTVar8->_vptr_TestEventListener[2])(pTVar8,in_RDI->parent_);
      uVar14 = FLAGS_gtest_repeat;
      if (bVar2) {
        uVar14 = 1;
      }
      bVar2 = (int)uVar14 < 0;
      bVar12 = (FLAGS_gtest_recreate_environments_when_repeating & 1) != 0 || bVar2;
      local_17c = 0;
      uVar13 = bVar12;
      uVar15 = uVar14;
LAB_001a78d6:
      uVar11 = bVar2 || local_17c != uVar14;
      if (bVar2 || local_17c != uVar14) {
        ClearNonAdHocTestResult((UnitTestImpl *)0x1a7912);
        Timer::Timer((Timer *)in_stack_fffffffffffffd50);
        if ((0 < iVar4) && ((FLAGS_gtest_shuffle & 1) != 0)) {
          this_01 = (Random *)random(in_RDI);
          Random::Reseed(this_01,in_RDI->random_seed_);
          ShuffleTests((UnitTestImpl *)
                       CONCAT44(uVar15,CONCAT13(uVar13,CONCAT12(uVar11,in_stack_fffffffffffffd80))))
          ;
        }
        (*pTVar8->_vptr_TestEventListener[3])(pTVar8,in_RDI->parent_,(ulong)local_17c);
        if (0 < iVar4) {
          if ((local_17c == 0) || (bVar12)) {
            (*pTVar8->_vptr_TestEventListener[4])(pTVar8,in_RDI->parent_);
            ForEach<std::vector<testing::Environment*,std::allocator<testing::Environment*>>,void(*)(testing::Environment*)>
                      ((vector<testing::Environment_*,_std::allocator<testing::Environment_*>_> *)
                       CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                       (_func_void_Environment_ptr *)
                       CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
            (*pTVar8->_vptr_TestEventListener[5])(pTVar8,in_RDI->parent_);
          }
          bVar3 = Test::IsSkipped();
          if (bVar3) {
            this_02 = GetUnitTestImpl();
            current_test_result(this_02);
            iVar5 = 0;
            while (in_stack_fffffffffffffe6c = iVar5,
                  iVar7 = TestResult::total_part_count((TestResult *)0x1a7a25), iVar5 < iVar7) {
              local_1a0 = TestResult::GetTestPartResult
                                    ((TestResult *)
                                     CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                                     in_stack_fffffffffffffd5c);
              TVar6 = TestPartResult::type(local_1a0);
              if (TVar6 == kSkip) {
                in_stack_fffffffffffffd68 =
                     (reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment_**,_std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>_>_>
                      *)TestPartResult::message((TestPartResult *)0x1a7a72);
                in_stack_fffffffffffffd70 =
                     (reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment_**,_std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>_>_>
                      *)&stack0xfffffffffffffe37;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88,
                           (allocator<char> *)
                           CONCAT44(uVar15,CONCAT13(uVar13,CONCAT12(uVar11,in_stack_fffffffffffffd80
                                                                   ))));
                std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe37);
                local_1a8 = local_1c8;
                uVar10 = std::__cxx11::string::c_str();
                printf("%s\n",uVar10);
                std::__cxx11::string::~string(local_1c8);
              }
              iVar5 = in_stack_fffffffffffffe6c + 1;
            }
            fflush(_stdout);
          }
          else {
            bVar3 = Test::HasFatalFailure();
            if (bVar3) {
              bVar3 = Test::HasFatalFailure();
              if (bVar3) {
                in_stack_fffffffffffffd5c = 0;
                while (iVar5 = in_stack_fffffffffffffd5c,
                      iVar7 = total_test_suite_count((UnitTestImpl *)0x1a7c85),
                      in_stack_fffffffffffffd5c < iVar7) {
                  GetMutableSuiteCase((UnitTestImpl *)
                                      CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                                      in_stack_fffffffffffffd5c);
                  TestSuite::Skip((TestSuite *)
                                  CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
                  in_stack_fffffffffffffd5c = iVar5 + 1;
                }
              }
            }
            else {
              local_1d0 = 0;
              while (in_stack_fffffffffffffd64 = local_1d0,
                    iVar5 = total_test_suite_count((UnitTestImpl *)0x1a7b93),
                    in_stack_fffffffffffffd64 < iVar5) {
                GetMutableSuiteCase((UnitTestImpl *)
                                    CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                                    in_stack_fffffffffffffd5c);
                TestSuite::Run((TestSuite *)in_stack_fffffffffffffdc0);
                if ((FLAGS_gtest_fail_fast & 1) != 0) {
                  GetMutableSuiteCase((UnitTestImpl *)
                                      CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                                      in_stack_fffffffffffffd5c);
                  bVar3 = TestSuite::Failed((TestSuite *)in_stack_fffffffffffffd50);
                  if (bVar3) goto LAB_001a7bf3;
                }
                local_1d0 = local_1d0 + 1;
              }
            }
          }
          goto LAB_001a7cc1;
        }
        goto LAB_001a7d5e;
      }
      (*pTVar8->_vptr_TestEventListener[0x11])(pTVar8,in_RDI->parent_);
      local_1e9 = 1;
      ForEach<std::vector<testing::Environment*,std::allocator<testing::Environment*>>,void(*)(testing::Environment*)>
                ((vector<testing::Environment_*,_std::allocator<testing::Environment_*>_> *)
                 CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                 (_func_void_Environment_ptr *)
                 CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>::clear
                ((vector<testing::Environment_*,_std::allocator<testing::Environment_*>_> *)0x1a7e49
                );
      bVar2 = ShouldWarnIfNoTestsMatchFilter
                        ((UnitTestImpl *)
                         CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      if (bVar2) {
        __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_251;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88,
                   (allocator<char> *)
                   CONCAT44(uVar15,CONCAT13(uVar13,CONCAT12(uVar11,in_stack_fffffffffffffd80))));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),(char *)__rhs);
        std::__cxx11::string::~string(local_230);
        std::__cxx11::string::~string(local_250);
        std::allocator<char>::~allocator(&local_251);
        uVar10 = std::__cxx11::string::c_str();
        ColoredPrintf(kRed,"WARNING: %s",uVar10);
        AppendToTestWarningsOutputFile(in_stack_fffffffffffffd90);
        std::__cxx11::string::~string(local_210);
      }
      if ((local_11 & 1) == 0) {
        ColoredPrintf(kRed,
                      "\nIMPORTANT NOTICE - DO NOT IGNORE:\nThis test program did NOT call testing::InitGoogleTest() before calling RUN_ALL_TESTS(). This is INVALID. Soon Google Test will start to enforce the valid usage. Please fix it ASAP, or IT WILL START TO FAIL.\n"
                     );
      }
      local_1 = (bool)(bVar1 ^ 1);
    }
    else {
      ListTestsMatchingFilter(in_stack_00000080);
      local_1 = true;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
LAB_001a7bf3:
  while( true ) {
    in_stack_fffffffffffffd60 = local_1d0 + 1;
    local_1d0 = in_stack_fffffffffffffd60;
    iVar5 = total_test_suite_count((UnitTestImpl *)0x1a7c08);
    if (iVar5 <= in_stack_fffffffffffffd60) break;
    GetMutableSuiteCase((UnitTestImpl *)
                        CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                        in_stack_fffffffffffffd5c);
    TestSuite::Skip((TestSuite *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
  }
LAB_001a7cc1:
  if ((local_17c == uVar14 - 1) || (bVar12)) {
    (*pTVar8->_vptr_TestEventListener[0xe])(pTVar8,in_RDI->parent_);
    std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>::rbegin
              ((vector<testing::Environment_*,_std::allocator<testing::Environment_*>_> *)
               CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>::rend
              ((vector<testing::Environment_*,_std::allocator<testing::Environment_*>_> *)
               CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    __std__for_each<std::reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment**,std::vector<testing::Environment*,std::allocator<testing::Environment*>>>>,void(*)(testing::Environment*)>_std__reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment**,std::vector<testing::Environment*,std::allocator<testing::Environment*>>>>_std__reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment**,std::vector<testing::Environment*,std::allocator<testing::Environment*>>>>_void____testing__Environment____
              (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
               (_func_void_Environment_ptr *)
               CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    (*pTVar8->_vptr_TestEventListener[0xf])(pTVar8,in_RDI->parent_);
  }
LAB_001a7d5e:
  TVar9 = Timer::Elapsed((Timer *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
  in_RDI->elapsed_time_ = TVar9;
  (*pTVar8->_vptr_TestEventListener[0x10])(pTVar8,in_RDI->parent_,(ulong)local_17c);
  bVar3 = Passed((UnitTestImpl *)0x1a7da0);
  if (!bVar3) {
    bVar1 = 1;
  }
  UnshuffleTests((UnitTestImpl *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
  if ((FLAGS_gtest_shuffle & 1) != 0) {
    iVar5 = GetNextRandomSeed((int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
    in_RDI->random_seed_ = iVar5;
  }
  local_17c = local_17c + 1;
  goto LAB_001a78d6;
}

Assistant:

bool UnitTestImpl::RunAllTests() {
  // True if and only if Google Test is initialized before RUN_ALL_TESTS() is
  // called.
  const bool gtest_is_initialized_before_run_all_tests = GTestIsInitialized();

  // Do not run any test if the --help flag was specified.
  if (g_help_flag) return true;

  // Repeats the call to the post-flag parsing initialization in case the
  // user didn't call InitGoogleTest.
  PostFlagParsingInit();

  // Handle the case where the program has no tests linked.
  // Sometimes this is a programmer mistake, but sometimes it is intended.
  if (total_test_count() == 0) {
    constexpr char kNoTestLinkedMessage[] =
        "This test program does NOT link in any test case.";
    constexpr char kNoTestLinkedFatal[] =
        "This is INVALID. Please make sure to link in at least one test case.";
    constexpr char kNoTestLinkedWarning[] =
        "Please make sure this is intended.";
    const bool fail_if_no_test_linked = GTEST_FLAG_GET(fail_if_no_test_linked);
    ColoredPrintf(
        GTestColor::kRed, "%s %s\n", kNoTestLinkedMessage,
        fail_if_no_test_linked ? kNoTestLinkedFatal : kNoTestLinkedWarning);
    if (fail_if_no_test_linked) {
      return false;
    }
#if GTEST_HAS_FILE_SYSTEM
    AppendToTestWarningsOutputFile(std::string(kNoTestLinkedMessage) + ' ' +
                                   kNoTestLinkedWarning + '\n');
#endif  // GTEST_HAS_FILE_SYSTEM
  }

#if GTEST_HAS_FILE_SYSTEM
  // Even if sharding is not on, test runners may want to use the
  // GTEST_SHARD_STATUS_FILE to query whether the test supports the sharding
  // protocol.
  internal::WriteToShardStatusFileIfNeeded();
#endif  // GTEST_HAS_FILE_SYSTEM

  // True if and only if we are in a subprocess for running a thread-safe-style
  // death test.
  bool in_subprocess_for_death_test = false;

#ifdef GTEST_HAS_DEATH_TEST
  in_subprocess_for_death_test = (internal_run_death_test_flag_ != nullptr);
#if defined(GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_)
  if (in_subprocess_for_death_test) {
    GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_();
  }
#endif  // defined(GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_)
#endif  // GTEST_HAS_DEATH_TEST

  const bool should_shard = ShouldShard(kTestTotalShards, kTestShardIndex,
                                        in_subprocess_for_death_test);

  // Compares the full test names with the filter to decide which
  // tests to run.
  const bool has_tests_to_run =
      FilterTests(should_shard ? HONOR_SHARDING_PROTOCOL
                               : IGNORE_SHARDING_PROTOCOL) > 0;

  // Lists the tests and exits if the --gtest_list_tests flag was specified.
  if (GTEST_FLAG_GET(list_tests)) {
    // This must be called *after* FilterTests() has been called.
    ListTestsMatchingFilter();
    return true;
  }

  random_seed_ = GetRandomSeedFromFlag(GTEST_FLAG_GET(random_seed));

  // True if and only if at least one test has failed.
  bool failed = false;

  TestEventListener* repeater = listeners()->repeater();

  start_timestamp_ = GetTimeInMillis();
  repeater->OnTestProgramStart(*parent_);

  // How many times to repeat the tests?  We don't want to repeat them
  // when we are inside the subprocess of a death test.
  const int repeat = in_subprocess_for_death_test ? 1 : GTEST_FLAG_GET(repeat);

  // Repeats forever if the repeat count is negative.
  const bool gtest_repeat_forever = repeat < 0;

  // Should test environments be set up and torn down for each repeat, or only
  // set up on the first and torn down on the last iteration? If there is no
  // "last" iteration because the tests will repeat forever, always recreate the
  // environments to avoid leaks in case one of the environments is using
  // resources that are external to this process. Without this check there would
  // be no way to clean up those external resources automatically.
  const bool recreate_environments_when_repeating =
      GTEST_FLAG_GET(recreate_environments_when_repeating) ||
      gtest_repeat_forever;

  for (int i = 0; gtest_repeat_forever || i != repeat; i++) {
    // We want to preserve failures generated by ad-hoc test
    // assertions executed before RUN_ALL_TESTS().
    ClearNonAdHocTestResult();

    Timer timer;

    // Shuffles test suites and tests if requested.
    if (has_tests_to_run && GTEST_FLAG_GET(shuffle)) {
      random()->Reseed(static_cast<uint32_t>(random_seed_));
      // This should be done before calling OnTestIterationStart(),
      // such that a test event listener can see the actual test order
      // in the event.
      ShuffleTests();
    }

    // Tells the unit test event listeners that the tests are about to start.
    repeater->OnTestIterationStart(*parent_, i);

    // Runs each test suite if there is at least one test to run.
    if (has_tests_to_run) {
      // Sets up all environments beforehand. If test environments aren't
      // recreated for each iteration, only do so on the first iteration.
      if (i == 0 || recreate_environments_when_repeating) {
        repeater->OnEnvironmentsSetUpStart(*parent_);
        ForEach(environments_, SetUpEnvironment);
        repeater->OnEnvironmentsSetUpEnd(*parent_);
      }

      // Runs the tests only if there was no fatal failure or skip triggered
      // during global set-up.
      if (Test::IsSkipped()) {
        // Emit diagnostics when global set-up calls skip, as it will not be
        // emitted by default.
        TestResult& test_result =
            *internal::GetUnitTestImpl()->current_test_result();
        for (int j = 0; j < test_result.total_part_count(); ++j) {
          const TestPartResult& test_part_result =
              test_result.GetTestPartResult(j);
          if (test_part_result.type() == TestPartResult::kSkip) {
            const std::string& result = test_part_result.message();
            printf("%s\n", result.c_str());
          }
        }
        fflush(stdout);
      } else if (!Test::HasFatalFailure()) {
        for (int test_index = 0; test_index < total_test_suite_count();
             test_index++) {
          GetMutableSuiteCase(test_index)->Run();
          if (GTEST_FLAG_GET(fail_fast) &&
              GetMutableSuiteCase(test_index)->Failed()) {
            for (int j = test_index + 1; j < total_test_suite_count(); j++) {
              GetMutableSuiteCase(j)->Skip();
            }
            break;
          }
        }
      } else if (Test::HasFatalFailure()) {
        // If there was a fatal failure during the global setup then we know we
        // aren't going to run any tests. Explicitly mark all of the tests as
        // skipped to make this obvious in the output.
        for (int test_index = 0; test_index < total_test_suite_count();
             test_index++) {
          GetMutableSuiteCase(test_index)->Skip();
        }
      }

      // Tears down all environments in reverse order afterwards. If test
      // environments aren't recreated for each iteration, only do so on the
      // last iteration.
      if (i == repeat - 1 || recreate_environments_when_repeating) {
        repeater->OnEnvironmentsTearDownStart(*parent_);
        std::for_each(environments_.rbegin(), environments_.rend(),
                      TearDownEnvironment);
        repeater->OnEnvironmentsTearDownEnd(*parent_);
      }
    }

    elapsed_time_ = timer.Elapsed();

    // Tells the unit test event listener that the tests have just finished.
    repeater->OnTestIterationEnd(*parent_, i);

    // Gets the result and clears it.
    if (!Passed()) {
      failed = true;
    }

    // Restores the original test order after the iteration.  This
    // allows the user to quickly repro a failure that happens in the
    // N-th iteration without repeating the first (N - 1) iterations.
    // This is not enclosed in "if (GTEST_FLAG(shuffle)) { ... }", in
    // case the user somehow changes the value of the flag somewhere
    // (it's always safe to unshuffle the tests).
    UnshuffleTests();

    if (GTEST_FLAG_GET(shuffle)) {
      // Picks a new random seed for each iteration.
      random_seed_ = GetNextRandomSeed(random_seed_);
    }
  }

  repeater->OnTestProgramEnd(*parent_);
  // Destroy environments in normal code, not in static teardown.
  bool delete_environment_on_teardown = true;
  if (delete_environment_on_teardown) {
    ForEach(environments_, internal::Delete<Environment>);
    environments_.clear();
  }

  // Try to warn the user if no tests matched the test filter.
  if (ShouldWarnIfNoTestsMatchFilter()) {
    const std::string filter_warning =
        std::string("filter \"") + GTEST_FLAG_GET(filter) +
        "\" did not match any test; no tests were run\n";
    ColoredPrintf(GTestColor::kRed, "WARNING: %s", filter_warning.c_str());
#if GTEST_HAS_FILE_SYSTEM
    AppendToTestWarningsOutputFile(filter_warning);
#endif  // GTEST_HAS_FILE_SYSTEM
  }

  if (!gtest_is_initialized_before_run_all_tests) {
    ColoredPrintf(
        GTestColor::kRed,
        "\nIMPORTANT NOTICE - DO NOT IGNORE:\n"
        "This test program did NOT call " GTEST_INIT_GOOGLE_TEST_NAME_
        "() before calling RUN_ALL_TESTS(). This is INVALID. Soon " GTEST_NAME_
        " will start to enforce the valid usage. "
        "Please fix it ASAP, or IT WILL START TO FAIL.\n");  // NOLINT
  }

  return !failed;
}